

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall
TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3>::TPZManVector
          (TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3> *this,
          TPZManVector<TPZManVector<TFad<6,_double>,_3>,_3> *copy)

{
  undefined1 auVar1 [16];
  ulong *puVar2;
  TPZManVector<TFad<6,_double>,_3> *pTVar3;
  TPZManVector<TFad<6,_double>,_3> *pTVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  
  (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNAlloc = 0;
  (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore =
       (TPZManVector<TFad<6,_double>,_3> *)0x0;
  (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNElements = 0;
  (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>)._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_016ad1e8;
  pTVar4 = this->fExtAlloc;
  lVar5 = 0;
  pTVar3 = pTVar4;
  do {
    TPZManVector<TFad<6,_double>,_3>::TPZManVector(pTVar3,0);
    lVar5 = lVar5 + -0xe0;
    pTVar3 = pTVar3 + 1;
  } while (lVar5 != -0x2a0);
  uVar7 = (copy->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNElements;
  if ((long)uVar7 < 4) {
    uVar6 = 0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar7;
    uVar6 = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0xe0),8) == 0) {
      uVar6 = SUB168(auVar1 * ZEXT816(0xe0),0) | 8;
    }
    puVar2 = (ulong *)operator_new__(uVar6);
    *puVar2 = uVar7;
    pTVar4 = (TPZManVector<TFad<6,_double>,_3> *)(puVar2 + 1);
    lVar5 = 0;
    pTVar3 = pTVar4;
    do {
      TPZManVector<TFad<6,_double>,_3>::TPZManVector(pTVar3,0);
      lVar5 = lVar5 + -0xe0;
      pTVar3 = pTVar3 + 1;
      uVar6 = uVar7;
    } while (uVar7 * -0xe0 - lVar5 != 0);
  }
  (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore = pTVar4;
  (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNElements = uVar7;
  (this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fNAlloc = uVar6;
  uVar6 = 0;
  if ((long)uVar7 < 1) {
    uVar7 = uVar6;
  }
  while (bVar8 = uVar7 != 0, uVar7 = uVar7 - 1, bVar8) {
    TPZManVector<TFad<6,_double>,_3>::operator=
              ((TPZManVector<TFad<6,_double>,_3> *)
               ((long)((this->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore)->fExtAlloc[0]
                      .dx_ + (uVar6 - 0x30)),
               (TPZManVector<TFad<6,_double>,_3> *)
               ((long)((copy->super_TPZVec<TPZManVector<TFad<6,_double>,_3>_>).fStore)->fExtAlloc[0]
                      .dx_ + (uVar6 - 0x30)));
    uVar6 = uVar6 + 0xe0;
  }
  return;
}

Assistant:

inline TPZManVector< T, NumExtAlloc >::TPZManVector(const TPZManVector< T, NumExtAlloc >& copy) {
    const int64_t size = copy.NElements();

    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }

    for (int64_t i = 0; i < size; i++) {
        this->fStore[i] = copy.fStore[i];
    }
}